

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase52::run(TestCase52 *this)

{
  undefined4 uVar1;
  uint uVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 local_80;
  StructReader reader;
  PointerReader local_48;
  AlignedData<2> data;
  
  local_48.pointer = (WirePointer *)&data;
  data.words[0].content = (word)0x100000000;
  data.words[1].content = (word)0xefcdab8967452301;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  PointerReader::getStruct(&reader,&local_48,(word *)0x0);
  if (reader.dataSize < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      uVar6 = 0;
LAB_001e0ad6:
      local_48.segment = (SegmentReader *)0xefcdab8967452301;
      local_80 = uVar6;
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3e,ERROR,
                 "\"failed: expected \" \"(0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,(unsigned_long_long *)&local_48,&local_80);
      goto LAB_001e0b0b;
    }
LAB_001e0b62:
    if (0x1f < reader.dataSize) goto LAB_001e0b83;
    if (kj::_::Debug::minSeverity < 3) {
      uVar1 = 0;
      goto LAB_001e0ba6;
    }
LAB_001e0ca8:
    if (0xf < reader.dataSize) goto LAB_001e0cc9;
    if (kj::_::Debug::minSeverity < 3) {
      sVar3 = 0;
      goto LAB_001e0cec;
    }
LAB_001e1183:
    if (reader.dataSize != 0) goto LAB_001e1187;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001e11b9:
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x51,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS)\"",
               (char (*) [57])"failed: expected reader.getDataField<bool>(0 * ELEMENTS)");
  }
  else {
    uVar6 = *reader.data;
    if ((uVar6 != 0xefcdab8967452301) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e0ad6;
LAB_001e0b0b:
    if (reader.dataSize < 0x80) goto LAB_001e0b62;
    if ((*(SegmentReader **)((long)reader.data + 8) != (SegmentReader *)0x0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_80 = local_80 & 0xffffffff00000000;
      local_48.segment = *(SegmentReader **)((long)reader.data + 8);
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))\", 0u, reader.getDataField<uint64_t>(1 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))",
                 (uint *)&local_80,(unsigned_long *)&local_48);
      goto LAB_001e0b62;
    }
LAB_001e0b83:
    if ((*reader.data != 0x67452301) && (kj::_::Debug::minSeverity < 3)) {
      uVar1 = *reader.data;
LAB_001e0ba6:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452301);
      local_80 = CONCAT44(local_80._4_4_,uVar1);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))\", 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
    }
    if (reader.dataSize < 0x40) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e0ca8;
      iVar5 = 0;
LAB_001e0c1f:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcdab89);
      local_80 = CONCAT44(local_80._4_4_,iVar5);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x41,ERROR,
                 "\"failed: expected \" \"(0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))\", 0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
    }
    else {
      iVar5 = *(int *)((long)reader.data + 4);
      if ((iVar5 != -0x10325477) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e0c1f;
    }
    if (reader.dataSize < 0x60) goto LAB_001e0ca8;
    if ((*(int *)((long)reader.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
      local_80 = CONCAT44(local_80._4_4_,*(int *)((long)reader.data + 8));
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
      goto LAB_001e0ca8;
    }
LAB_001e0cc9:
    sVar3 = *reader.data;
    if ((sVar3 != 0x2301) && (kj::_::Debug::minSeverity < 3)) {
LAB_001e0cec:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2301);
      local_80 = CONCAT62(local_80._2_6_,sVar3);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))\", 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))",
                 (uint *)&local_48,(unsigned_short *)&local_80);
    }
    if (reader.dataSize < 0x20) {
      if (kj::_::Debug::minSeverity < 3) {
        sVar3 = 0;
LAB_001e0d66:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x6745);
        local_80 = CONCAT62(local_80._2_6_,sVar3);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x44,ERROR,
                   "\"failed: expected \" \"(0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))\", 0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
        goto LAB_001e0d9b;
      }
LAB_001e0fe8:
      if (0xf < reader.dataSize) goto LAB_001e100b;
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e1183;
      uVar4 = 0x141;
LAB_001e1034:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2240);
      local_80 = CONCAT62(local_80._2_6_,uVar4);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"(321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u)"
                 ,(char (*) [89])
                  "failed: expected (321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))"
                 ,(uint *)&local_48,(unsigned_short *)&local_80);
    }
    else {
      sVar3 = *(short *)((long)reader.data + 2);
      if ((sVar3 != 0x6745) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e0d66;
LAB_001e0d9b:
      if (reader.dataSize < 0x30) {
        if (kj::_::Debug::minSeverity < 3) {
          sVar3 = 0;
          goto LAB_001e0de0;
        }
LAB_001e0f6c:
        if (0x1f < reader.dataSize) goto LAB_001e0f8c;
        if (2 < kj::_::Debug::minSeverity) goto LAB_001e0fe8;
        uVar2 = 0x141;
LAB_001e0fb4:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452240);
        local_80 = CONCAT44(local_80._4_4_,uVar2);
        kj::_::Debug::log<char_const(&)[93],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4a,ERROR,
                   "\"failed: expected \" \"(321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u)"
                   ,(char (*) [93])
                    "failed: expected (321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))"
                   ,(uint *)&local_48,(uint *)&local_80);
        goto LAB_001e0fe8;
      }
      sVar3 = *(short *)((long)reader.data + 4);
      if ((sVar3 != -0x5477) && (kj::_::Debug::minSeverity < 3)) {
LAB_001e0de0:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xab89);
        local_80 = CONCAT62(local_80._2_6_,sVar3);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x45,ERROR,
                   "\"failed: expected \" \"(0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))\", 0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
      }
      if (reader.dataSize < 0x40) {
        if (2 < kj::_::Debug::minSeverity) goto LAB_001e0f6c;
        sVar3 = 0;
LAB_001e0e5a:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcd);
        local_80 = CONCAT62(local_80._2_6_,sVar3);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x46,ERROR,
                   "\"failed: expected \" \"(0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))\", 0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
      }
      else {
        sVar3 = *(short *)((long)reader.data + 6);
        if ((sVar3 != -0x1033) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e0e5a;
      }
      if (reader.dataSize < 0x50) {
LAB_001e0ee7:
        if (0x3f < reader.dataSize) goto LAB_001e0f0b;
        if (2 < kj::_::Debug::minSeverity) goto LAB_001e0f6c;
        local_80 = 0x141;
LAB_001e0f37:
        local_48.segment = (SegmentReader *)0xefcdab8967452240;
        kj::_::Debug::log<char_const(&)[103],unsigned_long_long,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x49,ERROR,
                   "\"failed: expected \" \"(321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))\", 321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u)"
                   ,(char (*) [103])
                    "failed: expected (321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))"
                   ,(unsigned_long_long *)&local_48,&local_80);
        goto LAB_001e0f6c;
      }
      if ((*(short *)((long)reader.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
        local_80 = CONCAT62(local_80._2_6_,*(short *)((long)reader.data + 8));
        kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x47,ERROR,
                   "\"failed: expected \" \"(0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))\", 0u, reader.getDataField<uint16_t>(4 * ELEMENTS)"
                   ,(char (*) [71])
                    "failed: expected (0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
        goto LAB_001e0ee7;
      }
LAB_001e0f0b:
      if ((*reader.data != 0xefcdab8967452301) && (kj::_::Debug::minSeverity < 3)) {
        local_80 = *reader.data ^ 0x141;
        goto LAB_001e0f37;
      }
LAB_001e0f8c:
      if ((*reader.data != 0x67452301) && (kj::_::Debug::minSeverity < 3)) {
        uVar2 = *reader.data ^ 0x141;
        goto LAB_001e0fb4;
      }
LAB_001e100b:
      if ((*reader.data != 0x2301) && (kj::_::Debug::minSeverity < 3)) {
        uVar4 = *reader.data ^ 0x141;
        goto LAB_001e1034;
      }
    }
    if (reader.dataSize < 0x80) {
LAB_001e10ca:
      if (0x5f < reader.dataSize) goto LAB_001e10cf;
LAB_001e1125:
      if (reader.dataSize < 0x50) goto LAB_001e1183;
    }
    else {
      if ((*(ulong *)((long)reader.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_80 = CONCAT44(local_80._4_4_,0x141);
        local_48.segment = (SegmentReader *)(*(ulong *)((long)reader.data + 8) ^ 0x141);
        kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4c,ERROR,
                   "\"failed: expected \" \"(321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u)"
                   ,(char (*) [79])
                    "failed: expected (321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))"
                   ,(uint *)&local_80,(unsigned_long *)&local_48);
        goto LAB_001e10ca;
      }
LAB_001e10cf:
      if ((*(int *)((long)reader.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
        local_80 = CONCAT44(local_80._4_4_,*(int *)((long)reader.data + 8)) ^ 0x141;
        kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4d,ERROR,
                   "\"failed: expected \" \"(321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u)"
                   ,(char (*) [79])
                    "failed: expected (321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))"
                   ,(uint *)&local_48,(uint *)&local_80);
        goto LAB_001e1125;
      }
    }
    if ((*(short *)((long)reader.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
      local_80 = CONCAT62(local_80._2_6_,*(short *)((long)reader.data + 8)) ^ 0x141;
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4e,ERROR,
                 "\"failed: expected \" \"(321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u)"
                 ,(char (*) [79])
                  "failed: expected (321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))",
                 (uint *)&local_48,(unsigned_short *)&local_80);
      goto LAB_001e1183;
    }
LAB_001e1187:
    if ((*reader.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001e11b9;
  }
  if (reader.dataSize < 2) {
LAB_001e13f1:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001e13f6:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 8 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 8 * ELEMENTS)");
      goto LAB_001e141a;
    }
LAB_001e1442:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001e1452:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 9 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 9 * ELEMENTS)");
      goto LAB_001e147f;
    }
LAB_001e16b8:
    if (reader.dataSize != 0) goto LAB_001e16bc;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001e16ee:
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x66,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS, false)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(0 * ELEMENTS, false)");
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *reader.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x52,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS))");
    }
    if (reader.dataSize < 3) goto LAB_001e13f1;
    if ((kj::_::Debug::minSeverity < 3 & *reader.data >> 2) == 1) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x53,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(2 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(2 * ELEMENTS))");
    }
    if (reader.dataSize < 4) goto LAB_001e13f1;
    if (((*reader.data & 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x54,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(3 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(3 * ELEMENTS))");
    }
    if (reader.dataSize < 5) goto LAB_001e13f1;
    if (((*reader.data & 0x10) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(4 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(4 * ELEMENTS))");
    }
    if (reader.dataSize < 6) goto LAB_001e13f1;
    if (((*reader.data & 0x20) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(5 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(5 * ELEMENTS))");
    }
    if (reader.dataSize < 7) goto LAB_001e13f1;
    if (((*reader.data & 0x40) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(6 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(6 * ELEMENTS))");
    }
    if (reader.dataSize < 8) goto LAB_001e13f1;
    if ((*reader.data < '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x58,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(7 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(7 * ELEMENTS))");
    }
    if (reader.dataSize < 9) goto LAB_001e13f1;
    if (((*(byte *)((long)reader.data + 1) & 1) == 0) && (kj::_::Debug::minSeverity < 3))
    goto LAB_001e13f6;
LAB_001e141a:
    if (reader.dataSize < 10) goto LAB_001e1442;
    if ((*(byte *)((long)reader.data + 1) & 2) == 0 && kj::_::Debug::minSeverity < 3)
    goto LAB_001e1452;
LAB_001e147f:
    if (reader.dataSize < 0xb) {
LAB_001e157a:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e16b8;
LAB_001e1583:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(13 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(13 * ELEMENTS)");
    }
    else {
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)reader.data + 1) >> 2) == 1) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5c,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(10 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(10 * ELEMENTS))");
      }
      if (reader.dataSize < 0xc) goto LAB_001e157a;
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)reader.data + 1) >> 3) == 1) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5d,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(11 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(11 * ELEMENTS))");
      }
      if (reader.dataSize < 0xd) goto LAB_001e157a;
      if (((*(byte *)((long)reader.data + 1) & 0x10) != 0) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5e,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(12 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(12 * ELEMENTS))");
      }
      if (reader.dataSize < 0xe) goto LAB_001e157a;
      if (((*(byte *)((long)reader.data + 1) & 0x20) == 0) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001e1583;
    }
    if (reader.dataSize < 0xf) {
LAB_001e164f:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e16b8;
LAB_001e1654:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(63 * ELEMENTS)");
    }
    else {
      if (((*(byte *)((long)reader.data + 1) & 0x40) != 0) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x60,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(14 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(14 * ELEMENTS))");
      }
      if (reader.dataSize < 0x10) goto LAB_001e164f;
      if ((*(char *)((long)reader.data + 1) < '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x61,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(15 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(15 * ELEMENTS))");
      }
      if (reader.dataSize < 0x40) goto LAB_001e164f;
      if ((-1 < *(char *)((long)reader.data + 7)) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001e1654;
    }
    if (reader.dataSize < 0x41) goto LAB_001e16b8;
    if (((*(byte *)((long)reader.data + 8) & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,100,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS))\"",
                 (char (*) [61])"failed: expected !(reader.getDataField<bool>(64 * ELEMENTS))");
      goto LAB_001e16b8;
    }
LAB_001e16bc:
    if ((*reader.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001e16ee;
  }
  if (reader.dataSize < 2) {
LAB_001e1783:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001e1788:
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS, false)\"",
                 (char (*) [65])"failed: expected reader.getDataField<bool>(63 * ELEMENTS, false)");
      goto LAB_001e17ac;
    }
LAB_001e17ec:
    if (reader.dataSize != 0) goto LAB_001e17f0;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001e1822:
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(0 * ELEMENTS, true))\"",
               (char (*) [66])"failed: expected !(reader.getDataField<bool>(0 * ELEMENTS, true))");
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *reader.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x67,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS, false))\"",
                 (char (*) [67])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS, false))"
                );
    }
    if (reader.dataSize < 0x40) goto LAB_001e1783;
    if (-1 < *(char *)((long)reader.data + 7) && kj::_::Debug::minSeverity < 3) goto LAB_001e1788;
LAB_001e17ac:
    if (reader.dataSize < 0x41) goto LAB_001e17ec;
    if (((*(byte *)((long)reader.data + 8) & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS, false))\"",
                 (char (*) [68])
                 "failed: expected !(reader.getDataField<bool>(64 * ELEMENTS, false))");
      goto LAB_001e17ec;
    }
LAB_001e17f0:
    if ((*reader.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001e1822;
  }
  if (reader.dataSize < 2) {
LAB_001e18b7:
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *reader.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(1 * ELEMENTS, true)\"",
                 (char (*) [63])"failed: expected reader.getDataField<bool>(1 * ELEMENTS, true)");
    }
    if (reader.dataSize < 0x40) goto LAB_001e18b7;
    if (*(char *)((long)reader.data + 7) < '\0' || 2 < kj::_::Debug::minSeverity) goto LAB_001e18e0;
  }
  kj::_::Debug::log<char_const(&)[67]>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x6c,ERROR,
             "\"failed: expected \" \"!(reader.getDataField<bool>(63 * ELEMENTS, true))\"",
             (char (*) [67])"failed: expected !(reader.getDataField<bool>(63 * ELEMENTS, true))");
LAB_001e18e0:
  if (((0x40 < reader.dataSize) && ((*(byte *)((long)reader.data + 8) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(64 * ELEMENTS, true)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(64 * ELEMENTS, true)");
  }
  return;
}

Assistant:

TEST(WireFormat, SimpleRawDataStruct) {
  AlignedData<2> data = {{
    // Struct ref, offset = 1, dataSize = 1, pointerCount = 0
    0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00,
    // Content for the data section.
    0x01, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef
  }};

  StructReader reader = PointerReader::getRootUnchecked(data.words).getStruct(nullptr);

  EXPECT_EQ(0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint64_t>(1 * ELEMENTS));
  EXPECT_EQ(0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS));
  EXPECT_EQ(0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS));
  EXPECT_EQ(0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS));
  EXPECT_EQ(0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS));
  EXPECT_EQ(0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint16_t>(4 * ELEMENTS));

  EXPECT_EQ(321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u));

  // Bits
  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(2 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(3 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(4 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(5 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(6 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(7 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>( 8 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>( 9 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(10 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(11 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(12 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(13 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(15 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS, false));
  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(0 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(1 * ELEMENTS, true));
  EXPECT_FALSE(reader.getDataField<bool>(63 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(64 * ELEMENTS, true));
}